

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O0

int * floor1_fit(vorbis_block *vb,vorbis_look_floor1 *look,float *logmdct,float *logmask)

{
  vorbis_info_floor1 *info_00;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  int vx;
  int predicted;
  int y1_1;
  int y0_1;
  int x1;
  int x0;
  int hn_1;
  int ln_1;
  int ret1;
  int ret0;
  int hy1;
  int hy0;
  int ly1;
  int ly0;
  int hy;
  int ly;
  int hx;
  int lx;
  int hsortpos;
  int lsortpos;
  int hn;
  int ln;
  int sortpos;
  int y1;
  int y0;
  int memo [65];
  int *output;
  int hineighbor [65];
  int aiStack_1188 [2];
  int loneighbor [65];
  int local_1078 [2];
  int fit_valueB [65];
  int local_f68 [2];
  int fit_valueA [65];
  undefined1 local_e58 [8];
  lsfit_acc fits [64];
  long nonzero;
  long posts;
  long n;
  vorbis_info_floor1 *info;
  long j;
  long i;
  float *logmask_local;
  float *logmdct_local;
  vorbis_look_floor1 *look_local;
  vorbis_block *vb_local;
  
  info_00 = look->vi;
  iVar1 = look->n;
  iVar3 = look->posts;
  lVar6 = (long)iVar3;
  fits[0x3f].xyb = 0;
  fits[0x3f].bn = 0;
  stack0xffffffffffffed60 = (int *)0x0;
  for (j = 0; j < lVar6; j = j + 1) {
    local_f68[j] = -200;
  }
  for (j = 0; j < lVar6; j = j + 1) {
    local_1078[j] = -200;
  }
  for (j = 0; j < lVar6; j = j + 1) {
    aiStack_1188[j] = 0;
  }
  for (j = 0; j < lVar6; j = j + 1) {
    hineighbor[j + -2] = 1;
  }
  for (j = 0; j < lVar6; j = j + 1) {
    (&y1)[j] = -1;
  }
  if (lVar6 == 0) {
    iVar1 = accumulate_fit(logmask,logmdct,0,iVar1,(lsfit_acc *)local_e58,iVar1,info_00);
    fits[0x3f]._48_8_ = (long)iVar1 + fits[0x3f]._48_8_;
  }
  else {
    for (j = 0; j < lVar6 + -1; j = j + 1) {
      iVar2 = accumulate_fit(logmask,logmdct,look->sorted_index[j],look->sorted_index[j + 1],
                             (lsfit_acc *)&fits[j + -1].xyb,iVar1,info_00);
      fits[0x3f]._48_8_ = (long)iVar2 + fits[0x3f]._48_8_;
    }
  }
  if (fits[0x3f]._48_8_ != 0) {
    sortpos = -200;
    ln = -200;
    fit_line((lsfit_acc *)local_e58,iVar3 + -1,&sortpos,&ln,info_00);
    local_f68[0] = sortpos;
    local_1078[0] = sortpos;
    local_1078[1] = ln;
    local_f68[1] = ln;
    for (j = 2; j < lVar6; j = j + 1) {
      hn = look->reverse_index[j];
      lsortpos = aiStack_1188[hn];
      hsortpos = hineighbor[(long)hn + -2];
      if ((&y1)[lsortpos] != hsortpos) {
        lx = look->reverse_index[lsortpos];
        hx = look->reverse_index[hsortpos];
        (&y1)[lsortpos] = hsortpos;
        ly = info_00->postlist[lsortpos];
        hy = info_00->postlist[hsortpos];
        ly0 = post_Y(local_f68,local_1078,lsortpos);
        ly1 = post_Y(local_f68,local_1078,hsortpos);
        if ((ly0 == -1) || (ly1 == -1)) {
          exit(1);
        }
        iVar1 = inspect_error(ly,hy,ly0,ly1,logmask,logmdct,info_00);
        if (iVar1 == 0) {
          local_f68[j] = -200;
          local_1078[j] = -200;
        }
        else {
          hy0 = -200;
          hy1 = -200;
          ret0 = -200;
          ret1 = -200;
          iVar1 = fit_line((lsfit_acc *)&fits[(long)lx + -1].xyb,hn - lx,&hy0,&hy1,info_00);
          iVar3 = fit_line((lsfit_acc *)&fits[(long)hn + -1].xyb,hx - hn,&ret0,&ret1,info_00);
          if (iVar1 != 0) {
            hy0 = ly0;
            hy1 = ret0;
          }
          if (iVar3 != 0) {
            ret0 = hy1;
            ret1 = ly1;
          }
          if ((iVar1 == 0) || (iVar3 == 0)) {
            local_1078[lsortpos] = hy0;
            if (lsortpos == 0) {
              local_f68[0] = hy0;
            }
            local_f68[j] = hy1;
            local_1078[j] = ret0;
            local_f68[hsortpos] = ret1;
            if (hsortpos == 1) {
              local_1078[1] = ret1;
            }
            if ((-1 < hy1) || (-1 < ret0)) {
              info = (vorbis_info_floor1 *)(long)(hn + -1);
              while ((-1 < (long)info && (hineighbor[(long)((long)&info[-1].n + 2)] == hsortpos))) {
                hineighbor[(long)((long)&info[-1].n + 2)] = (int)j;
                info = (vorbis_info_floor1 *)((long)&info[-1].n + 3);
              }
              for (info = (vorbis_info_floor1 *)(long)(hn + 1);
                  ((long)info < lVar6 && (aiStack_1188[(long)info] == lsortpos));
                  info = (vorbis_info_floor1 *)((long)&info->partitions + 1)) {
                aiStack_1188[(long)info] = (int)j;
              }
            }
          }
          else {
            local_f68[j] = -200;
            local_1078[j] = -200;
          }
        }
      }
    }
    register0x00000000 = (int *)_vorbis_block_alloc(vb,lVar6 << 2);
    iVar1 = post_Y(local_f68,local_1078,0);
    *stack0xffffffffffffed60 = iVar1;
    iVar1 = post_Y(local_f68,local_1078,1);
    stack0xffffffffffffed60[1] = iVar1;
    for (j = 2; j < lVar6; j = j + 1) {
      uVar4 = render_point(info_00->postlist[look->loneighbor[j + -2]],
                           info_00->postlist[look->hineighbor[j + -2]],
                           stack0xffffffffffffed60[look->loneighbor[j + -2]],
                           stack0xffffffffffffed60[look->hineighbor[j + -2]],info_00->postlist[j]);
      uVar5 = post_Y(local_f68,local_1078,(int)j);
      if (((int)uVar5 < 0) || (uVar4 == uVar5)) {
        stack0xffffffffffffed60[j] = uVar4 | 0x8000;
      }
      else {
        stack0xffffffffffffed60[j] = uVar5;
      }
    }
  }
  return stack0xffffffffffffed60;
}

Assistant:

int *floor1_fit(vorbis_block *vb,vorbis_look_floor1 *look,
                          const float *logmdct,   /* in */
                          const float *logmask){
  long i,j;
  vorbis_info_floor1 *info=look->vi;
  long n=look->n;
  long posts=look->posts;
  long nonzero=0;
  lsfit_acc fits[VIF_POSIT+1];
  int fit_valueA[VIF_POSIT+2]; /* index by range list position */
  int fit_valueB[VIF_POSIT+2]; /* index by range list position */

  int loneighbor[VIF_POSIT+2]; /* sorted index of range list position (+2) */
  int hineighbor[VIF_POSIT+2];
  int *output=NULL;
  int memo[VIF_POSIT+2];

  for(i=0;i<posts;i++)fit_valueA[i]=-200; /* mark all unused */
  for(i=0;i<posts;i++)fit_valueB[i]=-200; /* mark all unused */
  for(i=0;i<posts;i++)loneighbor[i]=0; /* 0 for the implicit 0 post */
  for(i=0;i<posts;i++)hineighbor[i]=1; /* 1 for the implicit post at n */
  for(i=0;i<posts;i++)memo[i]=-1;      /* no neighbor yet */

  /* quantize the relevant floor points and collect them into line fit
     structures (one per minimal division) at the same time */
  if(posts==0){
    nonzero+=accumulate_fit(logmask,logmdct,0,n,fits,n,info);
  }else{
    for(i=0;i<posts-1;i++)
      nonzero+=accumulate_fit(logmask,logmdct,look->sorted_index[i],
                              look->sorted_index[i+1],fits+i,
                              n,info);
  }

  if(nonzero){
    /* start by fitting the implicit base case.... */
    int y0=-200;
    int y1=-200;
    fit_line(fits,posts-1,&y0,&y1,info);

    fit_valueA[0]=y0;
    fit_valueB[0]=y0;
    fit_valueB[1]=y1;
    fit_valueA[1]=y1;

    /* Non degenerate case */
    /* start progressive splitting.  This is a greedy, non-optimal
       algorithm, but simple and close enough to the best
       answer. */
    for(i=2;i<posts;i++){
      int sortpos=look->reverse_index[i];
      int ln=loneighbor[sortpos];
      int hn=hineighbor[sortpos];

      /* eliminate repeat searches of a particular range with a memo */
      if(memo[ln]!=hn){
        /* haven't performed this error search yet */
        int lsortpos=look->reverse_index[ln];
        int hsortpos=look->reverse_index[hn];
        memo[ln]=hn;

        {
          /* A note: we want to bound/minimize *local*, not global, error */
          int lx=info->postlist[ln];
          int hx=info->postlist[hn];
          int ly=post_Y(fit_valueA,fit_valueB,ln);
          int hy=post_Y(fit_valueA,fit_valueB,hn);

          if(ly==-1 || hy==-1){
            exit(1);
          }

          if(inspect_error(lx,hx,ly,hy,logmask,logmdct,info)){
            /* outside error bounds/begin search area.  Split it. */
            int ly0=-200;
            int ly1=-200;
            int hy0=-200;
            int hy1=-200;
            int ret0=fit_line(fits+lsortpos,sortpos-lsortpos,&ly0,&ly1,info);
            int ret1=fit_line(fits+sortpos,hsortpos-sortpos,&hy0,&hy1,info);

            if(ret0){
              ly0=ly;
              ly1=hy0;
            }
            if(ret1){
              hy0=ly1;
              hy1=hy;
            }

            if(ret0 && ret1){
              fit_valueA[i]=-200;
              fit_valueB[i]=-200;
            }else{
              /* store new edge values */
              fit_valueB[ln]=ly0;
              if(ln==0)fit_valueA[ln]=ly0;
              fit_valueA[i]=ly1;
              fit_valueB[i]=hy0;
              fit_valueA[hn]=hy1;
              if(hn==1)fit_valueB[hn]=hy1;

              if(ly1>=0 || hy0>=0){
                /* store new neighbor values */
                for(j=sortpos-1;j>=0;j--)
                  if(hineighbor[j]==hn)
                    hineighbor[j]=i;
                  else
                    break;
                for(j=sortpos+1;j<posts;j++)
                  if(loneighbor[j]==ln)
                    loneighbor[j]=i;
                  else
                    break;
              }
            }
          }else{
            fit_valueA[i]=-200;
            fit_valueB[i]=-200;
          }
        }
      }
    }

    output=_vorbis_block_alloc(vb,sizeof(*output)*posts);

    output[0]=post_Y(fit_valueA,fit_valueB,0);
    output[1]=post_Y(fit_valueA,fit_valueB,1);

    /* fill in posts marked as not using a fit; we will zero
       back out to 'unused' when encoding them so long as curve
       interpolation doesn't force them into use */
    for(i=2;i<posts;i++){
      int ln=look->loneighbor[i-2];
      int hn=look->hineighbor[i-2];
      int x0=info->postlist[ln];
      int x1=info->postlist[hn];
      int y0=output[ln];
      int y1=output[hn];

      int predicted=render_point(x0,x1,y0,y1,info->postlist[i]);
      int vx=post_Y(fit_valueA,fit_valueB,i);

      if(vx>=0 && predicted!=vx){
        output[i]=vx;
      }else{
        output[i]= predicted|0x8000;
      }
    }
  }

  return(output);

}